

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void __thiscall
DLevelScript::DoFadeRange
          (DLevelScript *this,int r1,int g1,int b1,int a1,int r2,int g2,int b2,int a2,int time)

{
  AActor *pAVar1;
  DFlashFader *this_00;
  uint uVar2;
  player_t *ppVar3;
  float r2_00;
  float g2_00;
  float b2_00;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  
  if (a1 < 0) {
    local_34 = 0.0;
    local_38 = 0.0;
    local_30 = 0.0;
    local_2c = 0.0;
  }
  else {
    local_2c = (float)r1 / 255.0;
    local_30 = (float)g1 / 255.0;
    local_38 = (float)b1 / 255.0;
    local_34 = (float)a1 * 1.5258789e-05;
  }
  r2_00 = (float)r2 / 255.0;
  g2_00 = (float)g2 / 255.0;
  b2_00 = (float)b2 / 255.0;
  pAVar1 = (this->activator).field_0.p;
  uVar2 = 0;
  if (pAVar1 == (AActor *)0x0) goto LAB_003bbfcb;
  if (((pAVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
    ppVar3 = ((this->activator).field_0.p)->player;
    uVar2 = 8;
    if (ppVar3 == (player_t *)0x0) {
      return;
    }
    do {
      if ((float)time * 1.5258789e-05 <= 0.0) {
        ppVar3->BlendR = r2_00;
        ppVar3->BlendG = g2_00;
        ppVar3->BlendB = b2_00;
        ppVar3->BlendA = (float)a2 * 1.5258789e-05;
      }
      else {
        if (a1 < 0) {
          local_34 = 0.0;
          local_38 = b2_00;
          local_30 = g2_00;
          local_2c = r2_00;
          if (0.0 < ppVar3->BlendA) {
            local_2c = ppVar3->BlendR;
            local_30 = ppVar3->BlendG;
            local_38 = ppVar3->BlendB;
            local_34 = ppVar3->BlendA;
          }
        }
        this_00 = (DFlashFader *)
                  M_Malloc_Dbg(0x68,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                               ,0x1f9);
        DFlashFader::DFlashFader
                  (this_00,local_2c,local_30,local_38,local_34,r2_00,g2_00,b2_00,
                   (float)a2 * 1.5258789e-05,(float)time * 1.5258789e-05,&ppVar3->mo->super_AActor);
      }
      do {
        uVar2 = uVar2 + 1;
LAB_003bbfcb:
        if (7 < (int)uVar2) {
          return;
        }
      } while (playeringame[uVar2] != true);
      ppVar3 = (player_t *)(&players + (ulong)uVar2 * 0x54);
    } while( true );
  }
  (this->activator).field_0.p = (AActor *)0x0;
  uVar2 = 0;
  goto LAB_003bbfcb;
}

Assistant:

void DLevelScript::DoFadeRange (int r1, int g1, int b1, int a1,
								int r2, int g2, int b2, int a2, int time)
{
	player_t *viewer;
	float ftime = (float)time / 65536.f;
	bool fadingFrom = a1 >= 0;
	float fr1 = 0, fg1 = 0, fb1 = 0, fa1 = 0;
	float fr2, fg2, fb2, fa2;
	int i;

	fr2 = (float)r2 / 255.f;
	fg2 = (float)g2 / 255.f;
	fb2 = (float)b2 / 255.f;
	fa2 = (float)a2 / 65536.f;

	if (fadingFrom)
	{
		fr1 = (float)r1 / 255.f;
		fg1 = (float)g1 / 255.f;
		fb1 = (float)b1 / 255.f;
		fa1 = (float)a1 / 65536.f;
	}

	if (activator != NULL)
	{
		viewer = activator->player;
		if (viewer == NULL)
			return;
		i = MAXPLAYERS;
		goto showme;
	}
	else
	{
		for (i = 0; i < MAXPLAYERS; ++i)
		{
			if (playeringame[i])
			{
				viewer = &players[i];
showme:
				if (ftime <= 0.f)
				{
					viewer->BlendR = fr2;
					viewer->BlendG = fg2;
					viewer->BlendB = fb2;
					viewer->BlendA = fa2;
				}
				else
				{
					if (!fadingFrom)
					{
						if (viewer->BlendA <= 0.f)
						{
							fr1 = fr2;
							fg1 = fg2;
							fb1 = fb2;
							fa1 = 0.f;
						}
						else
						{
							fr1 = viewer->BlendR;
							fg1 = viewer->BlendG;
							fb1 = viewer->BlendB;
							fa1 = viewer->BlendA;
						}
					}
					new DFlashFader (fr1, fg1, fb1, fa1, fr2, fg2, fb2, fa2, ftime, viewer->mo);
				}
			}
		}
	}
}